

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void setDWPTEntropy(wpt_object wt,char *entropy,double eparam)

{
  int iVar1;
  double eparam_local;
  char *entropy_local;
  wpt_object wt_local;
  
  iVar1 = strcmp(entropy,"shannon");
  if (iVar1 == 0) {
    strcpy(wt->entropy,"shannon");
  }
  else {
    iVar1 = strcmp(entropy,"threshold");
    if (iVar1 == 0) {
      strcpy(wt->entropy,"threshold");
      wt->eparam = eparam;
    }
    else {
      iVar1 = strcmp(entropy,"norm");
      if (iVar1 == 0) {
        strcpy(wt->entropy,"norm");
        wt->eparam = eparam;
      }
      else {
        iVar1 = strcmp(entropy,"logenergy");
        if (((iVar1 != 0) && (iVar1 = strcmp(entropy,"log energy"), iVar1 != 0)) &&
           (iVar1 = strcmp(entropy,"energy"), iVar1 != 0)) {
          printf("Entropy should be one of shannon, threshold, norm or logenergy");
          exit(-1);
        }
        strcpy(wt->entropy,"logenergy");
      }
    }
  }
  return;
}

Assistant:

void setDWPTEntropy(wpt_object wt, const char *entropy, double eparam) {
	if (!strcmp(entropy, "shannon")) {
		strcpy(wt->entropy, "shannon");
	}
	else if (!strcmp(entropy, "threshold")) {
		strcpy(wt->entropy, "threshold");
		wt ->eparam = eparam;
	}
	else if (!strcmp(entropy, "norm")) {
		strcpy(wt->entropy, "norm");
		wt->eparam = eparam;
	}
	else if (!strcmp(entropy, "logenergy") || !strcmp(entropy, "log energy") || !strcmp(entropy, "energy")) {
		strcpy(wt->entropy, "logenergy");
	}
	else {
		printf("Entropy should be one of shannon, threshold, norm or logenergy");
		exit(-1);
	}
}